

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::MatchExpr::MatchExpr
          (MatchExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
          *cases,unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *anyCase)

{
  bool bVar1;
  pointer this_00;
  reference __t;
  __tuple_element_t<2UL,_tuple<const_Token_*,_vector<const_Token_*,_allocator<const_Token_*>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *this_01;
  pointer this_02;
  tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  *matchp;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  *__range1;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *anyCase_local;
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  *cases_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr_local;
  Position *pos_local;
  Lexer *lexer_local;
  MatchExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_MATCH,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__MatchExpr_00176970;
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr(&this->expr,expr);
  std::
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ::vector(&this->cases,cases);
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::unique_ptr
            (&this->anyCase,anyCase);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->expr);
  if (!bVar1) {
    __assert_fail("!!this->expr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x2d9,
                  "pfederc::MatchExpr::MatchExpr(const Lexer &, const Position &, std::unique_ptr<Expr> &&, std::vector<MatchPattern> &&, std::unique_ptr<BodyExpr> &&)"
                 );
  }
  this_00 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                      (&this->expr);
  Expr::setParent(this_00,&this->super_Expr);
  __end1 = std::
           vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
           ::begin(&this->cases);
  matchp = (tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
            *)std::
              vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
              ::end(&this->cases);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_*,_std::vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>_>
                                *)&matchp);
    if (!bVar1) break;
    __t = __gnu_cxx::
          __normal_iterator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_*,_std::vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>_>
          ::operator*(&__end1);
    this_01 = std::
              get<2ul,pfederc::Token_const*,std::vector<pfederc::Token_const*,std::allocator<pfederc::Token_const*>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                        (__t);
    this_02 = std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::
              operator->(this_01);
    Expr::setParent(&this_02->super_Expr,&this->super_Expr);
    __gnu_cxx::
    __normal_iterator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_*,_std::vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>_>
    ::operator++(&__end1);
  }
  _setParent<pfederc::BodyExpr>(&this->anyCase,&this->super_Expr);
  return;
}

Assistant:

MatchExpr::MatchExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Expr> &&expr,
    std::vector<MatchPattern> &&cases,
    std::unique_ptr<BodyExpr> &&anyCase) noexcept
    : Expr(lexer, ExprType::EXPR_MATCH, pos), expr(std::move(expr)),
      cases(std::move(cases)),
      anyCase(std::move(anyCase)) {
  assert(!!this->expr);

  this->expr->setParent(this);
  for (auto &matchp : this->cases) {
    std::get<2>(matchp)->setParent(this);
  }

  _setParent(this->anyCase, this);
}